

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pdf_unicode.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s;
  char *pcVar1;
  ostream *poVar2;
  undefined8 extraout_RAX;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var3;
  QPDFObjectHandle str;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88 [24];
  string local_70 [32];
  string local_50 [32];
  
  __s = *argv;
  pcVar1 = strrchr(__s,0x2f);
  whoami = pcVar1 + 1;
  if (pcVar1 == (char *)0x0) {
    whoami = __s;
  }
  if (argc == 2) {
    QUtil::read_lines_from_file_abi_cxx11_((char *)local_88,SUB81(argv[1],0));
    p_Var3 = local_88;
    while (p_Var3 = *(_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      **)p_Var3, p_Var3 != local_88) {
      QPDFObjectHandle::newUnicodeString((string *)&str);
      QPDFObjectHandle::getUTF8Value_abi_cxx11_();
      poVar2 = std::operator<<((ostream *)&std::cout,local_50);
      poVar2 = std::operator<<(poVar2," // ");
      QPDFObjectHandle::unparseBinary_abi_cxx11_();
      poVar2 = std::operator<<(poVar2,local_70);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&str.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(local_88);
    return 0;
  }
  usage();
  std::__cxx11::string::~string(local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&str.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(local_88);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
main(int argc, char* argv[])
{
    if ((whoami = strrchr(argv[0], '/')) == nullptr) {
        whoami = argv[0];
    } else {
        ++whoami;
    }

    if (argc != 2) {
        usage();
    }
    char const* infilename = argv[1];
    for (auto const& line: QUtil::read_lines_from_file(infilename)) {
        QPDFObjectHandle str = QPDFObjectHandle::newUnicodeString(line);
        std::cout << str.getUTF8Value() << " // " << str.unparseBinary() << std::endl;
    }
    return 0;
}